

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

void __thiscall jsonnet::internal::PrettyFieldNames::visit(PrettyFieldNames *this,Object *expr)

{
  pointer pOVar1;
  bool bVar2;
  long lVar3;
  Identifier *pIVar4;
  ObjectField *field;
  pointer pOVar5;
  Fodder *a;
  
  pOVar1 = (expr->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pOVar5 = (expr->fields).
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar5 != pOVar1; pOVar5 = pOVar5 + 1) {
    if (pOVar5->kind == FIELD_EXPR) {
      if (pOVar5->expr1 == (AST *)0x0) {
        lVar3 = 0;
      }
      else {
        lVar3 = __dynamic_cast(pOVar5->expr1,&AST::typeinfo,&LiteralString::typeinfo,0);
      }
      if (lVar3 != 0) {
        pOVar5->kind = FIELD_STR;
        fodder_move_front((Fodder *)(lVar3 + 0x50),&pOVar5->fodder1);
        a = &pOVar5->fodderL;
        if (pOVar5->methodSugar == false) {
          a = &pOVar5->opFodder;
        }
        fodder_move_front(a,&pOVar5->fodder2);
      }
    }
    if (pOVar5->kind == FIELD_STR) {
      if (pOVar5->expr1 == (AST *)0x0) {
        lVar3 = 0;
      }
      else {
        lVar3 = __dynamic_cast(pOVar5->expr1,&AST::typeinfo,&LiteralString::typeinfo,0);
      }
      if (lVar3 != 0) {
        bVar2 = isIdentifier(this,(UString *)(lVar3 + 0x80));
        if (bVar2) {
          pOVar5->kind = FIELD_ID;
          pIVar4 = Allocator::makeIdentifier
                             ((this->super_FmtPass).super_CompilerPass.alloc,
                              (UString *)(lVar3 + 0x80));
          pOVar5->id = pIVar4;
          std::
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          ::operator=(&pOVar5->fodder1,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)(lVar3 + 0x50));
          pOVar5->expr1 = (AST *)0x0;
        }
      }
    }
  }
  CompilerPass::visit((CompilerPass *)this,expr);
  return;
}

Assistant:

void visit(Object *expr)
    {
        for (auto &field : expr->fields) {
            // First try ["foo"] -> "foo".
            if (field.kind == ObjectField::FIELD_EXPR) {
                if (auto *field_expr = dynamic_cast<LiteralString *>(field.expr1)) {
                    field.kind = ObjectField::FIELD_STR;
                    fodder_move_front(field_expr->openFodder, field.fodder1);
                    if (field.methodSugar) {
                        fodder_move_front(field.fodderL, field.fodder2);
                    } else {
                        fodder_move_front(field.opFodder, field.fodder2);
                    }
                }
            }
            // Then try "foo" -> foo.
            if (field.kind == ObjectField::FIELD_STR) {
                if (auto *lit = dynamic_cast<LiteralString *>(field.expr1)) {
                    if (isIdentifier(lit->value)) {
                        field.kind = ObjectField::FIELD_ID;
                        field.id = alloc.makeIdentifier(lit->value);
                        field.fodder1 = lit->openFodder;
                        field.expr1 = nullptr;
                    }
                }
            }
        }
        FmtPass::visit(expr);
    }